

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::Server::listen_internal(Server *this)

{
  int iVar1;
  bool bVar2;
  anon_class_16_2_3fe5dd7f_for__M_head_impl local_40;
  thread local_30;
  
  this->is_running_ = true;
  do {
    while( true ) {
      iVar1 = detail::select_read(this->svr_sock_,0,100000);
      if (iVar1 == 0) break;
      iVar1 = accept(this->svr_sock_,(sockaddr *)0x0,(socklen_t *)0x0);
      if (iVar1 == -1) {
        if (this->svr_sock_ != -1) {
          close(this->svr_sock_);
          bVar2 = false;
          goto LAB_00158276;
        }
        goto LAB_00158273;
      }
      local_40.this = this;
      local_40.sock = iVar1;
      std::thread::thread<httplib::Server::listen_internal()::_lambda()_1_,,void>
                (&local_30,&local_40);
      std::thread::detach();
      std::thread::~thread(&local_30);
    }
  } while (this->svr_sock_ != -1);
LAB_00158273:
  bVar2 = true;
LAB_00158276:
  do {
    local_40.this = (Server *)0xa;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&local_40);
    std::mutex::lock(&this->running_threads_mutex_);
    iVar1 = this->running_threads_;
    pthread_mutex_unlock((pthread_mutex_t *)&this->running_threads_mutex_);
  } while (iVar1 != 0);
  this->is_running_ = false;
  return bVar2;
}

Assistant:

inline bool Server::listen_internal()
{
    auto ret = true;

    is_running_ = true;

    for (;;) {
        auto val = detail::select_read(svr_sock_, 0, 100000);

        if (val == 0) { // Timeout
            if (svr_sock_ == INVALID_SOCKET) {
                // The server socket was closed by 'stop' method.
                break;
            }
            continue;
        }

        socket_t sock = accept(svr_sock_, NULL, NULL);

        if (sock == INVALID_SOCKET) {
            if (svr_sock_ != INVALID_SOCKET) {
                detail::close_socket(svr_sock_);
                ret = false;
            } else {
                ; // The server socket was closed by user.
            }
            break;
        }

        // TODO: Use thread pool...
        std::thread([=]() {
            {
                std::lock_guard<std::mutex> guard(running_threads_mutex_);
                running_threads_++;
            }

            read_and_close_socket(sock);

            {
                std::lock_guard<std::mutex> guard(running_threads_mutex_);
                running_threads_--;
            }
        }).detach();
    }

    // TODO: Use thread pool...
    for (;;) {
        std::this_thread::sleep_for(std::chrono::milliseconds(10));
        std::lock_guard<std::mutex> guard(running_threads_mutex_);
        if (!running_threads_) {
            break;
        }
    }

    is_running_ = false;

    return ret;
}